

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O1

void Imf_2_5::anon_unknown_9::dctInverse8x8_sse2<1>(float *data)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined8 uVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fStack_88;
  float fStack_84;
  __m128 in [8];
  
  fVar38 = data[1];
  fVar30 = data[2];
  fVar12 = data[3];
  fVar33 = data[4];
  fVar23 = data[5];
  fVar35 = data[6];
  fVar28 = data[7];
  fVar31 = data[9];
  fVar11 = data[10];
  fVar13 = data[0xb];
  fVar14 = data[0xc];
  fVar8 = data[0xd];
  fVar9 = data[0xe];
  fVar10 = data[0xf];
  fVar21 = *data * 0.3535536 + 0.0;
  fVar22 = fVar21 + fVar30 * 0.4619398 + fVar33 * 0.3535536 + fVar35 * 0.1913422;
  fVar25 = fVar21 + fVar30 * 0.1913422 + fVar33 * -0.3535536 + fVar35 * -0.4619398;
  fVar27 = fVar21 + fVar30 * -0.1913422 + fVar33 * -0.3535536 + fVar35 * 0.4619398;
  fVar30 = fVar21 + fVar30 * -0.4619398 + fVar33 * 0.3535536 + fVar35 * -0.1913422;
  fVar33 = fVar38 * 0.4903927 + 0.0 + fVar12 * 0.4157349 + fVar23 * 0.2777855 + fVar28 * 0.09754573;
  fVar35 = fVar38 * 0.4157349 + 0.0 + fVar12 * -0.09754573 + fVar23 * -0.4903927 +
           fVar28 * -0.2777855;
  fVar21 = fVar38 * 0.2777855 + 0.0 + fVar12 * -0.4903927 + fVar23 * 0.09754573 + fVar28 * 0.4157349
  ;
  fVar38 = fVar38 * 0.09754573 + 0.0 + fVar12 * -0.2777855 + fVar23 * 0.4157349 +
           fVar28 * -0.4903927;
  *data = fVar22 + fVar33;
  data[1] = fVar25 + fVar35;
  data[2] = fVar27 + fVar21;
  data[3] = fVar30 + fVar38;
  data[4] = fVar30 - fVar38;
  data[5] = fVar27 - fVar21;
  data[6] = fVar25 - fVar35;
  data[7] = fVar22 - fVar33;
  fVar38 = data[8] * 0.3535536 + 0.0;
  fVar30 = fVar38 + fVar11 * 0.4619398 + fVar14 * 0.3535536 + fVar9 * 0.1913422;
  fVar12 = fVar38 + fVar11 * 0.1913422 + fVar14 * -0.3535536 + fVar9 * -0.4619398;
  fVar33 = fVar38 + fVar11 * -0.1913422 + fVar14 * -0.3535536 + fVar9 * 0.4619398;
  fVar38 = fVar38 + fVar11 * -0.4619398 + fVar14 * 0.3535536 + fVar9 * -0.1913422;
  fVar23 = fVar31 * 0.4903927 + 0.0 + fVar13 * 0.4157349 + fVar8 * 0.2777855 + fVar10 * 0.09754573;
  fVar35 = fVar31 * 0.4157349 + 0.0 + fVar13 * -0.09754573 + fVar8 * -0.4903927 +
           fVar10 * -0.2777855;
  fVar28 = fVar31 * 0.2777855 + 0.0 + fVar13 * -0.4903927 + fVar8 * 0.09754573 + fVar10 * 0.4157349;
  fVar31 = fVar31 * 0.09754573 + 0.0 + fVar13 * -0.2777855 + fVar8 * 0.4157349 + fVar10 * -0.4903927
  ;
  data[8] = fVar30 + fVar23;
  data[9] = fVar12 + fVar35;
  data[10] = fVar33 + fVar28;
  data[0xb] = fVar38 + fVar31;
  data[0xc] = fVar38 - fVar31;
  data[0xd] = fVar33 - fVar28;
  data[0xe] = fVar12 - fVar35;
  data[0xf] = fVar30 - fVar23;
  fVar38 = data[0x11];
  fVar30 = data[0x12];
  fVar12 = data[0x13];
  fVar33 = data[0x14];
  fVar23 = data[0x15];
  fVar35 = data[0x16];
  fVar28 = data[0x17];
  fVar31 = data[0x10] * 0.3535536 + 0.0;
  fVar11 = fVar31 + fVar30 * 0.4619398 + fVar33 * 0.3535536 + fVar35 * 0.1913422;
  fVar13 = fVar31 + fVar30 * 0.1913422 + fVar33 * -0.3535536 + fVar35 * -0.4619398;
  fVar14 = fVar31 + fVar30 * -0.1913422 + fVar33 * -0.3535536 + fVar35 * 0.4619398;
  fVar30 = fVar31 + fVar30 * -0.4619398 + fVar33 * 0.3535536 + fVar35 * -0.1913422;
  fVar33 = fVar38 * 0.4903927 + 0.0 + fVar12 * 0.4157349 + fVar23 * 0.2777855 + fVar28 * 0.09754573;
  fVar35 = fVar38 * 0.4157349 + 0.0 + fVar12 * -0.09754573 + fVar23 * -0.4903927 +
           fVar28 * -0.2777855;
  fVar31 = fVar38 * 0.2777855 + 0.0 + fVar12 * -0.4903927 + fVar23 * 0.09754573 + fVar28 * 0.4157349
  ;
  fVar38 = fVar38 * 0.09754573 + 0.0 + fVar12 * -0.2777855 + fVar23 * 0.4157349 +
           fVar28 * -0.4903927;
  data[0x10] = fVar11 + fVar33;
  data[0x11] = fVar13 + fVar35;
  data[0x12] = fVar14 + fVar31;
  data[0x13] = fVar30 + fVar38;
  data[0x14] = fVar30 - fVar38;
  data[0x15] = fVar14 - fVar31;
  data[0x16] = fVar13 - fVar35;
  data[0x17] = fVar11 - fVar33;
  fVar38 = data[0x19];
  fVar30 = data[0x1a];
  fVar12 = data[0x1b];
  fVar33 = data[0x1c];
  fVar23 = data[0x1d];
  fVar35 = data[0x1e];
  fVar28 = data[0x1f];
  fVar31 = data[0x18] * 0.3535536 + 0.0;
  fVar11 = fVar31 + fVar30 * 0.4619398 + fVar33 * 0.3535536 + fVar35 * 0.1913422;
  fVar13 = fVar31 + fVar30 * 0.1913422 + fVar33 * -0.3535536 + fVar35 * -0.4619398;
  fVar14 = fVar31 + fVar30 * -0.1913422 + fVar33 * -0.3535536 + fVar35 * 0.4619398;
  fVar30 = fVar31 + fVar30 * -0.4619398 + fVar33 * 0.3535536 + fVar35 * -0.1913422;
  fVar33 = fVar38 * 0.4903927 + 0.0 + fVar12 * 0.4157349 + fVar23 * 0.2777855 + fVar28 * 0.09754573;
  fVar35 = fVar38 * 0.4157349 + 0.0 + fVar12 * -0.09754573 + fVar23 * -0.4903927 +
           fVar28 * -0.2777855;
  fVar31 = fVar38 * 0.2777855 + 0.0 + fVar12 * -0.4903927 + fVar23 * 0.09754573 + fVar28 * 0.4157349
  ;
  fVar38 = fVar38 * 0.09754573 + 0.0 + fVar12 * -0.2777855 + fVar23 * 0.4157349 +
           fVar28 * -0.4903927;
  data[0x18] = fVar11 + fVar33;
  data[0x19] = fVar13 + fVar35;
  data[0x1a] = fVar14 + fVar31;
  data[0x1b] = fVar30 + fVar38;
  data[0x1c] = fVar30 - fVar38;
  data[0x1d] = fVar14 - fVar31;
  data[0x1e] = fVar13 - fVar35;
  data[0x1f] = fVar11 - fVar33;
  fVar38 = data[0x21];
  fVar30 = data[0x22];
  fVar12 = data[0x23];
  fVar33 = data[0x24];
  fVar23 = data[0x25];
  fVar35 = data[0x26];
  fVar28 = data[0x27];
  fVar31 = data[0x20] * 0.3535536 + 0.0;
  fVar11 = fVar31 + fVar30 * 0.4619398 + fVar33 * 0.3535536 + fVar35 * 0.1913422;
  fVar13 = fVar31 + fVar30 * 0.1913422 + fVar33 * -0.3535536 + fVar35 * -0.4619398;
  fVar14 = fVar31 + fVar30 * -0.1913422 + fVar33 * -0.3535536 + fVar35 * 0.4619398;
  fVar30 = fVar31 + fVar30 * -0.4619398 + fVar33 * 0.3535536 + fVar35 * -0.1913422;
  fVar33 = fVar38 * 0.4903927 + 0.0 + fVar12 * 0.4157349 + fVar23 * 0.2777855 + fVar28 * 0.09754573;
  fVar35 = fVar38 * 0.4157349 + 0.0 + fVar12 * -0.09754573 + fVar23 * -0.4903927 +
           fVar28 * -0.2777855;
  fVar31 = fVar38 * 0.2777855 + 0.0 + fVar12 * -0.4903927 + fVar23 * 0.09754573 + fVar28 * 0.4157349
  ;
  fVar38 = fVar38 * 0.09754573 + 0.0 + fVar12 * -0.2777855 + fVar23 * 0.4157349 +
           fVar28 * -0.4903927;
  data[0x20] = fVar11 + fVar33;
  data[0x21] = fVar13 + fVar35;
  data[0x22] = fVar14 + fVar31;
  data[0x23] = fVar30 + fVar38;
  data[0x24] = fVar30 - fVar38;
  data[0x25] = fVar14 - fVar31;
  data[0x26] = fVar13 - fVar35;
  data[0x27] = fVar11 - fVar33;
  fVar38 = data[0x29];
  fVar30 = data[0x2a];
  fVar12 = data[0x2b];
  fVar33 = data[0x2c];
  fVar23 = data[0x2d];
  fVar35 = data[0x2e];
  fVar28 = data[0x2f];
  fVar31 = data[0x28] * 0.3535536 + 0.0;
  fVar11 = fVar31 + fVar30 * 0.4619398 + fVar33 * 0.3535536 + fVar35 * 0.1913422;
  fVar13 = fVar31 + fVar30 * 0.1913422 + fVar33 * -0.3535536 + fVar35 * -0.4619398;
  fVar14 = fVar31 + fVar30 * -0.1913422 + fVar33 * -0.3535536 + fVar35 * 0.4619398;
  fVar30 = fVar31 + fVar30 * -0.4619398 + fVar33 * 0.3535536 + fVar35 * -0.1913422;
  fVar33 = fVar38 * 0.4903927 + 0.0 + fVar12 * 0.4157349 + fVar23 * 0.2777855 + fVar28 * 0.09754573;
  fVar35 = fVar38 * 0.4157349 + 0.0 + fVar12 * -0.09754573 + fVar23 * -0.4903927 +
           fVar28 * -0.2777855;
  fVar31 = fVar38 * 0.2777855 + 0.0 + fVar12 * -0.4903927 + fVar23 * 0.09754573 + fVar28 * 0.4157349
  ;
  fVar38 = fVar38 * 0.09754573 + 0.0 + fVar12 * -0.2777855 + fVar23 * 0.4157349 +
           fVar28 * -0.4903927;
  data[0x28] = fVar11 + fVar33;
  data[0x29] = fVar13 + fVar35;
  data[0x2a] = fVar14 + fVar31;
  data[0x2b] = fVar30 + fVar38;
  data[0x2c] = fVar30 - fVar38;
  data[0x2d] = fVar14 - fVar31;
  data[0x2e] = fVar13 - fVar35;
  data[0x2f] = fVar11 - fVar33;
  fVar38 = data[0x31];
  fVar30 = data[0x32];
  fVar12 = data[0x33];
  fVar33 = data[0x34];
  fVar23 = data[0x35];
  fVar35 = data[0x36];
  fVar28 = data[0x37];
  fVar31 = data[0x30] * 0.3535536 + 0.0;
  fVar11 = fVar31 + fVar30 * 0.4619398 + fVar33 * 0.3535536 + fVar35 * 0.1913422;
  fVar13 = fVar31 + fVar30 * 0.1913422 + fVar33 * -0.3535536 + fVar35 * -0.4619398;
  fVar14 = fVar31 + fVar30 * -0.1913422 + fVar33 * -0.3535536 + fVar35 * 0.4619398;
  fVar31 = fVar31 + fVar30 * -0.4619398 + fVar33 * 0.3535536 + fVar35 * -0.1913422;
  fVar30 = fVar38 * 0.4903927 + 0.0 + fVar12 * 0.4157349 + fVar23 * 0.2777855 + fVar28 * 0.09754573;
  fVar33 = fVar38 * 0.4157349 + 0.0 + fVar12 * -0.09754573 + fVar23 * -0.4903927 +
           fVar28 * -0.2777855;
  fVar35 = fVar38 * 0.2777855 + 0.0 + fVar12 * -0.4903927 + fVar23 * 0.09754573 + fVar28 * 0.4157349
  ;
  fVar38 = fVar38 * 0.09754573 + 0.0 + fVar12 * -0.2777855 + fVar23 * 0.4157349 +
           fVar28 * -0.4903927;
  data[0x30] = fVar11 + fVar30;
  data[0x31] = fVar13 + fVar33;
  data[0x32] = fVar14 + fVar35;
  data[0x33] = fVar31 + fVar38;
  data[0x34] = fVar31 - fVar38;
  data[0x35] = fVar14 - fVar35;
  data[0x36] = fVar13 - fVar33;
  data[0x37] = fVar11 - fVar30;
  lVar4 = 0;
  pfVar5 = data;
  do {
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)pfVar5 + lVar6 * 2);
      uVar3 = puVar1[1];
      *(undefined8 *)((long)in[-1] + lVar6 + 8) = *puVar1;
      *(undefined8 *)((long)in[0] + lVar6) = uVar3;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x80);
    fVar9 = in[1][2] * 0.1913422 - in[5][2] * 0.4619398;
    fVar10 = in[1][3] * 0.1913422 - in[5][3] * 0.4619398;
    fVar21 = in[2][0] * 0.1913422 - in[6][0] * 0.4619398;
    fVar22 = in[2][1] * 0.1913422 - in[6][1] * 0.4619398;
    fVar25 = in[5][2] * 0.1913422 + in[1][2] * 0.4619398;
    fVar27 = in[5][3] * 0.1913422 + in[1][3] * 0.4619398;
    fVar15 = in[6][0] * 0.1913422 + in[2][0] * 0.4619398;
    fVar16 = in[6][1] * 0.1913422 + in[2][1] * 0.4619398;
    fVar38 = in[6][2] * 0.09754573 + in[4][2] * 0.2777855 +
             in[2][2] * 0.4157349 + in[0][2] * 0.4903927;
    fVar30 = in[6][3] * 0.09754573 + in[4][3] * 0.2777855 +
             in[2][3] * 0.4157349 + in[0][3] * 0.4903927;
    fVar12 = in[7][0] * 0.09754573 + in[5][0] * 0.2777855 +
             in[3][0] * 0.4157349 + in[1][0] * 0.4903927;
    fVar33 = in[7][1] * 0.09754573 + in[5][1] * 0.2777855 +
             in[3][1] * 0.4157349 + in[1][1] * 0.4903927;
    fVar17 = (in[0][2] * 0.4157349 - in[2][2] * 0.09754573) -
             (in[6][2] * 0.2777855 + in[4][2] * 0.4903927);
    fVar18 = (in[0][3] * 0.4157349 - in[2][3] * 0.09754573) -
             (in[6][3] * 0.2777855 + in[4][3] * 0.4903927);
    fVar19 = (in[1][0] * 0.4157349 - in[3][0] * 0.09754573) -
             (in[7][0] * 0.2777855 + in[5][0] * 0.4903927);
    fVar20 = (in[1][1] * 0.4157349 - in[3][1] * 0.09754573) -
             (in[7][1] * 0.2777855 + in[5][1] * 0.4903927);
    fVar40 = in[6][2] * 0.4157349 + in[4][2] * 0.09754573 +
             (in[0][2] * 0.2777855 - in[2][2] * 0.4903927);
    fVar41 = in[6][3] * 0.4157349 + in[4][3] * 0.09754573 +
             (in[0][3] * 0.2777855 - in[2][3] * 0.4903927);
    fVar42 = in[7][0] * 0.4157349 + in[5][0] * 0.09754573 +
             (in[1][0] * 0.2777855 - in[3][0] * 0.4903927);
    fVar43 = in[7][1] * 0.4157349 + in[5][1] * 0.09754573 +
             (in[1][1] * 0.2777855 - in[3][1] * 0.4903927);
    fVar23 = (in[4][2] * 0.4157349 - in[6][2] * 0.4903927) +
             (in[0][2] * 0.09754573 - in[2][2] * 0.2777855);
    fVar35 = (in[4][3] * 0.4157349 - in[6][3] * 0.4903927) +
             (in[0][3] * 0.09754573 - in[2][3] * 0.2777855);
    fVar28 = (in[5][0] * 0.4157349 - in[7][0] * 0.4903927) +
             (in[1][0] * 0.09754573 - in[3][0] * 0.2777855);
    fVar31 = (in[5][1] * 0.4157349 - in[7][1] * 0.4903927) +
             (in[1][1] * 0.09754573 - in[3][1] * 0.2777855);
    fVar24 = (fStack_88 + in[3][2]) * 0.3535536;
    fVar26 = (fStack_84 + in[3][3]) * 0.3535536;
    fVar29 = (in[0][0] + in[4][0]) * 0.3535536;
    fVar32 = (in[0][1] + in[4][1]) * 0.3535536;
    fVar34 = (fStack_88 - in[3][2]) * 0.3535536;
    fVar36 = (fStack_84 - in[3][3]) * 0.3535536;
    fVar37 = (in[0][0] - in[4][0]) * 0.3535536;
    fVar39 = (in[0][1] - in[4][1]) * 0.3535536;
    fVar11 = fVar9 + fVar34;
    fVar13 = fVar10 + fVar36;
    fVar14 = fVar21 + fVar37;
    fVar8 = fVar22 + fVar39;
    fVar34 = fVar34 - fVar9;
    fVar36 = fVar36 - fVar10;
    fVar37 = fVar37 - fVar21;
    fVar39 = fVar39 - fVar22;
    fVar9 = fVar25 + fVar24;
    fVar10 = fVar27 + fVar26;
    fVar21 = fVar15 + fVar29;
    fVar22 = fVar16 + fVar32;
    fVar24 = fVar24 - fVar25;
    fVar26 = fVar26 - fVar27;
    fVar29 = fVar29 - fVar15;
    fVar32 = fVar32 - fVar16;
    pfVar2 = data + lVar4 * 4;
    *pfVar2 = fVar38 + fVar9;
    pfVar2[1] = fVar30 + fVar10;
    pfVar2[2] = fVar12 + fVar21;
    pfVar2[3] = fVar33 + fVar22;
    pfVar2 = data + lVar4 * 4 + 8;
    *pfVar2 = fVar17 + fVar11;
    pfVar2[1] = fVar18 + fVar13;
    pfVar2[2] = fVar19 + fVar14;
    pfVar2[3] = fVar20 + fVar8;
    pfVar2 = data + lVar4 * 4 + 0x10;
    *pfVar2 = fVar40 + fVar34;
    pfVar2[1] = fVar41 + fVar36;
    pfVar2[2] = fVar42 + fVar37;
    pfVar2[3] = fVar43 + fVar39;
    pfVar2 = data + lVar4 * 4 + 0x18;
    *pfVar2 = fVar23 + fVar24;
    pfVar2[1] = fVar35 + fVar26;
    pfVar2[2] = fVar28 + fVar29;
    pfVar2[3] = fVar31 + fVar32;
    pfVar2 = data + lVar4 * 4 + 0x20;
    *pfVar2 = fVar24 - fVar23;
    pfVar2[1] = fVar26 - fVar35;
    pfVar2[2] = fVar29 - fVar28;
    pfVar2[3] = fVar32 - fVar31;
    pfVar2 = data + lVar4 * 4 + 0x28;
    *pfVar2 = fVar34 - fVar40;
    pfVar2[1] = fVar36 - fVar41;
    pfVar2[2] = fVar37 - fVar42;
    pfVar2[3] = fVar39 - fVar43;
    pfVar2 = data + lVar4 * 4 + 0x30;
    *pfVar2 = fVar11 - fVar17;
    pfVar2[1] = fVar13 - fVar18;
    pfVar2[2] = fVar14 - fVar19;
    pfVar2[3] = fVar8 - fVar20;
    pfVar2 = data + lVar4 * 4 + 0x38;
    *pfVar2 = fVar9 - fVar38;
    pfVar2[1] = fVar10 - fVar30;
    pfVar2[2] = fVar21 - fVar12;
    pfVar2[3] = fVar22 - fVar33;
    pfVar5 = pfVar5 + 4;
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  return;
}

Assistant:

void
dctInverse8x8_sse2 (float *data)
{
    #ifdef IMF_HAVE_SSE2
        __m128 a  = {3.535536e-01f,3.535536e-01f,3.535536e-01f,3.535536e-01f};
        __m128 b  = {4.903927e-01f,4.903927e-01f,4.903927e-01f,4.903927e-01f};
        __m128 c  = {4.619398e-01f,4.619398e-01f,4.619398e-01f,4.619398e-01f};
        __m128 d  = {4.157349e-01f,4.157349e-01f,4.157349e-01f,4.157349e-01f};
        __m128 e  = {2.777855e-01f,2.777855e-01f,2.777855e-01f,2.777855e-01f};
        __m128 f  = {1.913422e-01f,1.913422e-01f,1.913422e-01f,1.913422e-01f};
        __m128 g  = {9.754573e-02f,9.754573e-02f,9.754573e-02f,9.754573e-02f};

        __m128 c0 = {3.535536e-01f, 3.535536e-01f, 3.535536e-01f, 3.535536e-01f};
        __m128 c1 = {4.619398e-01f, 1.913422e-01f,-1.913422e-01f,-4.619398e-01f};
        __m128 c2 = {3.535536e-01f,-3.535536e-01f,-3.535536e-01f, 3.535536e-01f};
        __m128 c3 = {1.913422e-01f,-4.619398e-01f, 4.619398e-01f,-1.913422e-01f};

        __m128 c4 = {4.903927e-01f, 4.157349e-01f, 2.777855e-01f, 9.754573e-02f};
        __m128 c5 = {4.157349e-01f,-9.754573e-02f,-4.903927e-01f,-2.777855e-01f};
        __m128 c6 = {2.777855e-01f,-4.903927e-01f, 9.754573e-02f, 4.157349e-01f};
        __m128 c7 = {9.754573e-02f,-2.777855e-01f, 4.157349e-01f,-4.903927e-01f};

        __m128 *srcVec = (__m128 *)data;
        __m128 x[8], evenSum, oddSum;
        __m128 in[8], alpha[4], beta[4], theta[4], gamma[4];
        
        //
        // Rows -   
        //
        //  Treat this just like matrix-vector multiplication. The
        //  trick is to note that:
        //
        //    [M00 M01 M02 M03][v0]   [(v0 M00) + (v1 M01) + (v2 M02) + (v3 M03)]
        //    [M10 M11 M12 M13][v1] = [(v0 M10) + (v1 M11) + (v2 M12) + (v3 M13)]
        //    [M20 M21 M22 M23][v2]   [(v0 M20) + (v1 M21) + (v2 M22) + (v3 M23)]
        //    [M30 M31 M32 M33][v3]   [(v0 M30) + (v1 M31) + (v2 M32) + (v3 M33)]
        //
        // Then, we can fill a register with v_i and multiply by the i-th column
        // of M, accumulating across all i-s. 
        //
        // The kids refer to the populating of a register with a single value
        // "broadcasting", and it can be done with a shuffle instruction. It
        // seems to be the slowest part of the whole ordeal.
        //
        // Our matrix columns are stored above in c0-c7. c0-3 make up M1, and
        // c4-7 are from M2.
        //

        #define DCT_INVERSE_8x8_SS2_ROW_LOOP(i)                             \
            /*                                                              \
             * Broadcast the components of the row                          \
             */                                                             \
                                                                            \
            x[0] = _mm_shuffle_ps (srcVec[2 * i],                           \
                                   srcVec[2 * i],                           \
                                   _MM_SHUFFLE (0, 0, 0, 0));               \
                                                                            \
            x[1] = _mm_shuffle_ps (srcVec[2 * i],                           \
                                   srcVec[2 * i],                           \
                                   _MM_SHUFFLE (1, 1, 1, 1));               \
                                                                            \
            x[2] = _mm_shuffle_ps (srcVec[2 * i],                           \
                                   srcVec[2 * i],                           \
                                   _MM_SHUFFLE (2, 2, 2, 2));               \
                                                                            \
            x[3] = _mm_shuffle_ps (srcVec[2 * i],                           \
                                   srcVec[2 * i],                           \
                                   _MM_SHUFFLE (3, 3, 3, 3));               \
                                                                            \
            x[4] = _mm_shuffle_ps (srcVec[2 * i + 1],                       \
                                   srcVec[2 * i + 1],                       \
                                   _MM_SHUFFLE (0, 0, 0, 0));               \
                                                                            \
            x[5] = _mm_shuffle_ps (srcVec[2 * i + 1],                       \
                                   srcVec[2 * i + 1],                       \
                                   _MM_SHUFFLE (1, 1, 1, 1));               \
                                                                            \
            x[6] = _mm_shuffle_ps (srcVec[2 * i + 1],                       \
                                   srcVec[2 * i + 1],                       \
                                   _MM_SHUFFLE (2, 2, 2, 2));               \
                                                                            \
            x[7] = _mm_shuffle_ps (srcVec[2 * i + 1],                       \
                                   srcVec[2 * i + 1],                       \
                                   _MM_SHUFFLE (3, 3, 3, 3));               \
            /*                                                              \
             * Multiply the components by each column of the matrix         \
             */                                                             \
                                                                            \
            x[0] = _mm_mul_ps (x[0], c0);                                   \
            x[2] = _mm_mul_ps (x[2], c1);                                   \
            x[4] = _mm_mul_ps (x[4], c2);                                   \
            x[6] = _mm_mul_ps (x[6], c3);                                   \
                                                                            \
            x[1] = _mm_mul_ps (x[1], c4);                                   \
            x[3] = _mm_mul_ps (x[3], c5);                                   \
            x[5] = _mm_mul_ps (x[5], c6);                                   \
            x[7] = _mm_mul_ps (x[7], c7);                                   \
                                                                            \
            /*                                                              \
             * Add across                                                   \
             */                                                             \
                                                                            \
            evenSum = _mm_setzero_ps();                                     \
            evenSum = _mm_add_ps (evenSum, x[0]);                           \
            evenSum = _mm_add_ps (evenSum, x[2]);                           \
            evenSum = _mm_add_ps (evenSum, x[4]);                           \
            evenSum = _mm_add_ps (evenSum, x[6]);                           \
                                                                            \
            oddSum = _mm_setzero_ps();                                      \
            oddSum = _mm_add_ps (oddSum, x[1]);                             \
            oddSum = _mm_add_ps (oddSum, x[3]);                             \
            oddSum = _mm_add_ps (oddSum, x[5]);                             \
            oddSum = _mm_add_ps (oddSum, x[7]);                             \
                                                                            \
            /*                                                              \
             * Final Sum:                                                   \
             *    out [0, 1, 2, 3] = evenSum + oddSum                       \
             *    out [7, 6, 5, 4] = evenSum - oddSum                       \
             */                                                             \
                                                                            \
            srcVec[2 * i]     = _mm_add_ps (evenSum, oddSum);               \
            srcVec[2 * i + 1] = _mm_sub_ps (evenSum, oddSum);               \
            srcVec[2 * i + 1] = _mm_shuffle_ps (srcVec[2 * i + 1],          \
                                                srcVec[2 * i + 1],          \
                                                _MM_SHUFFLE (0, 1, 2, 3));

        switch (zeroedRows)
        {
          case 0:
          default:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (5)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (6)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (7)
            break;

          case 1:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (5)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (6)
            break;

          case 2:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (5)
            break;

          case 3:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4)
            break;

          case 4:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3)
            break;

          case 5:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2)
            break;

          case 6:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            break;

          case 7:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            break;
        }

        //
        // Columns -
        //
        // This is slightly more straightforward, if less readable. Here
        // we just operate on 4 columns at a time, in two batches.
        //
        // The slight mess is to try and cache sub-expressions, which
        // we ignore in the row-wise pass.
        //

        for (int col = 0; col < 2; ++col)
        {

            for (int i = 0; i < 8; ++i)
                in[i] = srcVec[2 * i + col];

            alpha[0] = _mm_mul_ps (c, in[2]);
            alpha[1] = _mm_mul_ps (f, in[2]);
            alpha[2] = _mm_mul_ps (c, in[6]);
            alpha[3] = _mm_mul_ps (f, in[6]);

            beta[0] = _mm_add_ps (_mm_add_ps (_mm_mul_ps (in[1], b),
                                                          _mm_mul_ps (in[3], d)),
                                              _mm_add_ps (_mm_mul_ps (in[5], e),
                                                          _mm_mul_ps (in[7], g)));

            beta[1] = _mm_sub_ps (_mm_sub_ps (_mm_mul_ps (in[1], d),
                                                          _mm_mul_ps (in[3], g)),
                                              _mm_add_ps (_mm_mul_ps (in[5], b),
                                                          _mm_mul_ps (in[7], e)));

            beta[2] = _mm_add_ps (_mm_sub_ps (_mm_mul_ps (in[1], e),
                                                          _mm_mul_ps (in[3], b)),
                                              _mm_add_ps (_mm_mul_ps (in[5], g),
                                                          _mm_mul_ps (in[7], d)));

            beta[3] = _mm_add_ps (_mm_sub_ps (_mm_mul_ps (in[1], g),
                                                          _mm_mul_ps (in[3], e)),
                                              _mm_sub_ps (_mm_mul_ps (in[5], d),
                                                          _mm_mul_ps (in[7], b)));

            theta[0] = _mm_mul_ps (a, _mm_add_ps (in[0], in[4]));
            theta[3] = _mm_mul_ps (a, _mm_sub_ps (in[0], in[4]));

            theta[1] = _mm_add_ps (alpha[0], alpha[3]);
            theta[2] = _mm_sub_ps (alpha[1], alpha[2]);

            gamma[0] = _mm_add_ps (theta[0], theta[1]);
            gamma[1] = _mm_add_ps (theta[3], theta[2]);
            gamma[2] = _mm_sub_ps (theta[3], theta[2]);
            gamma[3] = _mm_sub_ps (theta[0], theta[1]);

            srcVec[  col] = _mm_add_ps (gamma[0], beta[0]);
            srcVec[2+col] = _mm_add_ps (gamma[1], beta[1]);
            srcVec[4+col] = _mm_add_ps (gamma[2], beta[2]);
            srcVec[6+col] = _mm_add_ps (gamma[3], beta[3]);

            srcVec[ 8+col] = _mm_sub_ps (gamma[3], beta[3]);
            srcVec[10+col] = _mm_sub_ps (gamma[2], beta[2]);
            srcVec[12+col] = _mm_sub_ps (gamma[1], beta[1]);
            srcVec[14+col] = _mm_sub_ps (gamma[0], beta[0]);
        }

    #else /* IMF_HAVE_SSE2 */

        dctInverse8x8_scalar<zeroedRows> (data);

    #endif /* IMF_HAVE_SSE2 */
}